

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTf.cpp
# Opt level: O2

void __thiscall OpenMD::NPTf::loadEta(NPTf *this)

{
  RectMatrix<double,_3U,_3U> RStack_58;
  
  Snapshot::getBarostat
            ((Mat3x3d *)&RStack_58,
             (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
  RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)&this->eta,&RStack_58);
  return;
}

Assistant:

void NPTf::loadEta() {
    eta = snap->getBarostat();

    // if (!eta.isDiagonal()) {
    //    snprintf( painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
    //             "NPTf error: the diagonal elements of eta matrix are not the
    //             same or etaMat is not a diagonal matrix");
    //    painCave.isFatal = 1;
    //    simError();
    //}
  }